

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_php_generator.cc
# Opt level: O3

void __thiscall t_php_generator::generate_service(t_php_generator *this,t_service *tservice)

{
  long *plVar1;
  long *plVar2;
  _Alloc_hider _Var3;
  string f_service_name;
  allocator local_69;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  long *local_48;
  long local_40;
  long local_38;
  long lStack_30;
  
  if (this->classmap_ == true) {
    std::operator+(&local_68,&this->package_dir_,
                   &(this->super_t_oop_generator).super_t_generator.service_name_);
    plVar1 = (long *)std::__cxx11::string::append((char *)&local_68);
    plVar2 = plVar1 + 2;
    if ((long *)*plVar1 == plVar2) {
      local_38 = *plVar2;
      lStack_30 = plVar1[3];
      local_48 = &local_38;
    }
    else {
      local_38 = *plVar2;
      local_48 = (long *)*plVar1;
    }
    local_40 = plVar1[1];
    *plVar1 = (long)plVar2;
    plVar1[1] = 0;
    *(undefined1 *)(plVar1 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p);
    }
    std::__cxx11::string::string((string *)&local_68,(char *)local_48,&local_69);
    std::__cxx11::string::_M_assign
              ((string *)
               &(this->f_service_).super_ostringstream.
                super_basic_ostream<char,_std::char_traits<char>_>.field_0x70);
    template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::
    clear_buf(&this->f_service_);
    (this->f_service_).super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>.
    field_0x90 = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p);
    }
    generate_service_header(this,tservice,(ostream *)&this->f_service_);
    if (local_48 != &local_38) {
      operator_delete(local_48);
    }
  }
  generate_service_interface(this,tservice);
  if (this->rest_ == true) {
    generate_service_rest(this,tservice);
  }
  generate_service_client(this,tservice);
  generate_service_helpers(this,tservice);
  if (this->phps_ == true) {
    generate_service_processor(this,tservice);
  }
  if (this->classmap_ == true) {
    _Var3._M_p = ::endl_abi_cxx11_._M_dataplus._M_p;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&this->f_service_,::endl_abi_cxx11_._M_dataplus._M_p,
               ::endl_abi_cxx11_._M_string_length);
    template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::close
              (&this->f_service_,(int)_Var3._M_p);
  }
  return;
}

Assistant:

void t_php_generator::generate_service(t_service* tservice) {
  if(classmap_) {
    string f_service_name = package_dir_ + service_name_ + ".php";
    f_service_.open(f_service_name.c_str());
    generate_service_header(tservice, f_service_);
  }

  // Generate the three main parts of the service (well, two for now in PHP)
  generate_service_interface(tservice);
  if (rest_) {
    generate_service_rest(tservice);
  }
  generate_service_client(tservice);
  generate_service_helpers(tservice);
  if (phps_) {
    generate_service_processor(tservice);
  }

  if(classmap_) {
    // Close service file
    f_service_ << endl;
    f_service_.close();
  }
}